

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_tracesnap(lua_State *L)

{
  SnapEntry *pSVar1;
  uint uVar2;
  uint uVar3;
  GCtrace *pGVar4;
  SnapShot *pSVar5;
  GCtab *t_00;
  TValue *local_a0;
  TValue *local_98;
  TValue *local_90;
  TValue *local_88;
  GCtab *t;
  MSize nent;
  MSize n;
  SnapEntry *map;
  SnapShot *snap;
  SnapNo sn;
  GCtrace *T;
  lua_State *L_local;
  
  pGVar4 = jit_checktrace(L);
  uVar2 = lj_lib_checkint(L,2);
  if ((pGVar4 == (GCtrace *)0x0) || (pGVar4->nsnap <= uVar2)) {
    L_local._0_4_ = 0;
  }
  else {
    pSVar5 = pGVar4->snap + uVar2;
    pSVar1 = pGVar4->snapmap;
    uVar2 = pSVar5->mapofs;
    uVar3 = (uint)pSVar5->nent;
    lua_createtable(L,uVar3 + 2,0);
    t_00 = (GCtab *)(L->top[-1].u64 & 0x7fffffffffff);
    if (t_00->asize == 0) {
      local_88 = lj_tab_setinth(L,t_00,0);
    }
    else {
      local_88 = (TValue *)(t_00->array).ptr64;
    }
    local_88->n = (double)(int)(pSVar5->ref - 0x8000);
    if (t_00->asize < 2) {
      local_90 = lj_tab_setinth(L,t_00,1);
    }
    else {
      local_90 = (TValue *)((t_00->array).ptr64 + 8);
    }
    local_90->n = (double)pSVar5->nslots;
    for (t._4_4_ = 0; t._4_4_ < uVar3; t._4_4_ = t._4_4_ + 1) {
      if (t._4_4_ + 2 < t_00->asize) {
        local_98 = (TValue *)((t_00->array).ptr64 + (long)(int)(t._4_4_ + 2) * 8);
      }
      else {
        local_98 = lj_tab_setinth(L,t_00,t._4_4_ + 2);
      }
      local_98->n = (double)(int)pSVar1[(ulong)uVar2 + (ulong)t._4_4_];
    }
    if (uVar3 + 2 < t_00->asize) {
      local_a0 = (TValue *)((t_00->array).ptr64 + (long)(int)(uVar3 + 2) * 8);
    }
    else {
      local_a0 = lj_tab_setinth(L,t_00,uVar3 + 2);
    }
    local_a0->u64 = 0xc170000000000000;
    L_local._0_4_ = 1;
  }
  return (int)L_local;
}

Assistant:

LJLIB_CF(jit_util_tracesnap)
{
  GCtrace *T = jit_checktrace(L);
  SnapNo sn = (SnapNo)lj_lib_checkint(L, 2);
  if (T && sn < T->nsnap) {
    SnapShot *snap = &T->snap[sn];
    SnapEntry *map = &T->snapmap[snap->mapofs];
    MSize n, nent = snap->nent;
    GCtab *t;
    lua_createtable(L, nent+2, 0);
    t = tabV(L->top-1);
    setintV(lj_tab_setint(L, t, 0), (int32_t)snap->ref - REF_BIAS);
    setintV(lj_tab_setint(L, t, 1), (int32_t)snap->nslots);
    for (n = 0; n < nent; n++)
      setintV(lj_tab_setint(L, t, (int32_t)(n+2)), (int32_t)map[n]);
    setintV(lj_tab_setint(L, t, (int32_t)(nent+2)), (int32_t)SNAP(255, 0, 0));
    return 1;
  }
  return 0;
}